

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.cpp
# Opt level: O0

void __thiscall
randomx::CompiledLightVm<randomx::LargePageAllocator,_false,_false>::run
          (CompiledLightVm<randomx::LargePageAllocator,_false,_false> *this,void *seed)

{
  ProgramConfiguration *in_RSI;
  Program *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  randomx_vm *in_stack_00000040;
  uint32_t datasetOffset;
  Program *prog;
  
  prog = in_RDI;
  VmBase<randomx::LargePageAllocator,_false>::generateProgram
            ((VmBase<randomx::LargePageAllocator,_false> *)in_RSI,in_RDI);
  datasetOffset = (uint32_t)((ulong)in_RDI >> 0x20);
  randomx_vm::initialize(in_stack_00000040);
  JitCompilerX86::generateProgramLight(unaff_retaddr,prog,in_RSI,datasetOffset);
  CompiledVm<randomx::LargePageAllocator,_false,_false>::execute
            ((CompiledVm<randomx::LargePageAllocator,_false,_false> *)in_RSI);
  return;
}

Assistant:

void CompiledLightVm<Allocator, softAes, secureJit>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		randomx_vm::initialize();
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateProgramLight(program, config, datasetOffset);
		if (secureJit) {
			compiler.enableExecution();
		}
		CompiledVm<Allocator, softAes, secureJit>::execute();
	}